

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

void kmpp_objs_init(void)

{
  int *piVar1;
  rk_s32 *prVar2;
  MppTrieInfo *pMVar3;
  undefined4 *puVar4;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  undefined4 local_84;
  undefined4 local_80;
  rk_s32 local_78;
  rk_s32 local_74;
  rk_s32 local_70;
  int local_6c;
  MppTrieInfo *info_objdef;
  MppTrie trie_objdef;
  char *name;
  KmppObjDefImpl *impl;
  rk_u64 uaddr;
  MPP_RET local_38;
  rk_s32 i;
  rk_s32 ret;
  rk_s32 count;
  rk_s32 offset;
  rk_s32 fd;
  MppTrieInfo *info;
  MppTrie trie;
  void *root;
  KmppObjs *p;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  root = objs;
  trie = (MppTrie)0x0;
  info = (MppTrieInfo *)0x0;
  count = -1;
  if (objs != (KmppObjs *)0x0) {
    if ((kmpp_obj_debug & 1) != 0) {
      _mpp_log_l(4,"kmpp_obj","objs already inited %p\n",(char *)0x0,objs);
    }
    kmpp_objs_deinit();
    root = (void *)0x0;
  }
  mpp_env_get_u32("kmpp_obj_debug",&kmpp_obj_debug,0);
  count = open(kmpp_objs_init::dev,2);
  if (count < 0) {
    if ((kmpp_obj_debug & 1) != 0) {
      _mpp_log_l(4,"kmpp_obj","%s open failed ret fd %d\n",(char *)0x0,kmpp_objs_init::dev,
                 (ulong)(uint)count);
    }
  }
  else {
    impl = (KmppObjDefImpl *)0x0;
    local_38 = ioctl(count,0x40046d01,&impl);
    if (local_38 < MPP_OK) {
      _mpp_log_l(2,"kmpp_obj","%s ioctl failed ret %d\n","kmpp_objs_init",kmpp_objs_init::dev,
                 (ulong)(uint)local_38);
    }
    else {
      trie = impl;
      if ((kmpp_obj_debug & 2) != 0) {
        _mpp_log_l(4,"kmpp_obj","query fd %d root %p from kernel\n",(char *)0x0,(ulong)(uint)count,
                   impl);
      }
      local_38 = mpp_trie_init_by_root(&info,trie);
      if ((local_38 == MPP_OK) && (info != (MppTrieInfo *)0x0)) {
        if ((kmpp_obj_debug & 2) != 0) {
          mpp_trie_dump(info,"kmpp_objs_init");
        }
        _offset = mpp_trie_get_info(info,"__count");
        if (_offset == (MppTrieInfo *)0x0) {
          local_6c = 0;
        }
        else {
          piVar1 = (int *)mpp_trie_info_ctx(_offset);
          local_6c = *piVar1;
        }
        i = local_6c;
        root = mpp_osal_calloc("kmpp_objs_init",(long)local_6c * 0x20 + 0x28);
        if ((rk_s32 *)root != (rk_s32 *)0x0) {
          *(rk_s32 *)root = count;
          *(rk_s32 *)((long)root + 4) = i;
          *(MppTrieInfo **)((long)root + 0x18) = info;
          *(MppTrie *)((long)root + 0x20) = trie;
          _offset = mpp_trie_get_info(info,"__offset");
          if (_offset == (MppTrieInfo *)0x0) {
            local_70 = 0;
          }
          else {
            prVar2 = (rk_s32 *)mpp_trie_info_ctx(_offset);
            local_70 = *prVar2;
          }
          ret = local_70;
          *(rk_s32 *)((long)root + 8) = local_70;
          _offset = mpp_trie_get_info(info,"__priv");
          if (_offset == (MppTrieInfo *)0x0) {
            local_74 = 0;
          }
          else {
            prVar2 = (rk_s32 *)mpp_trie_info_ctx(_offset);
            local_74 = *prVar2;
          }
          ret = local_74;
          *(rk_s32 *)((long)root + 0xc) = local_74;
          _offset = mpp_trie_get_info(info,"__name_offset");
          if (_offset == (MppTrieInfo *)0x0) {
            local_78 = 0;
          }
          else {
            prVar2 = (rk_s32 *)mpp_trie_info_ctx(_offset);
            local_78 = *prVar2;
          }
          ret = local_78;
          *(rk_s32 *)((long)root + 0x10) = local_78;
          if ((kmpp_obj_debug & 2) != 0) {
            _mpp_log_l(4,"kmpp_obj","count %d object offsets - priv %d name %d entry %d\n",
                       (char *)0x0,(ulong)(uint)i,(ulong)*(uint *)((long)root + 0xc),
                       CONCAT44(uVar5,*(undefined4 *)((long)root + 0x10)),
                       *(undefined4 *)((long)root + 8));
          }
          _offset = mpp_trie_get_info_first(info);
          uaddr._4_4_ = 0;
          while( true ) {
            if (i <= (int)uaddr._4_4_ || _offset == (MppTrieInfo *)0x0) {
              objs = (KmppObjs *)root;
              return;
            }
            name = (char *)((long)root + (long)(int)uaddr._4_4_ * 0x20 + 0x28);
            trie_objdef = mpp_trie_info_name(_offset);
            info_objdef = (MppTrieInfo *)0x0;
            piVar1 = (int *)mpp_trie_info_ctx(_offset);
            ret = *piVar1;
            local_38 = mpp_trie_init_by_root(&info_objdef,(void *)((long)trie + (long)ret));
            if (info_objdef == (MppTrieInfo *)0x0) break;
            *(MppTrieInfo **)name = info_objdef;
            pMVar3 = mpp_trie_get_info(info_objdef,"__index");
            if (pMVar3 == (MppTrieInfo *)0x0) {
              local_80 = 0xffffffff;
            }
            else {
              puVar4 = (undefined4 *)mpp_trie_info_ctx(pMVar3);
              local_80 = *puVar4;
            }
            *(undefined4 *)(name + 8) = local_80;
            pMVar3 = mpp_trie_get_info(info_objdef,"__size");
            if (pMVar3 == (MppTrieInfo *)0x0) {
              local_84 = 0;
            }
            else {
              puVar4 = (undefined4 *)mpp_trie_info_ctx(pMVar3);
              local_84 = *puVar4;
            }
            *(undefined4 *)(name + 0x10) = local_84;
            *(MppTrie *)(name + 0x18) = trie_objdef;
            _offset = mpp_trie_get_info_next(info,_offset);
            if ((kmpp_obj_debug & 2) != 0) {
              _mpp_log_l(4,"kmpp_obj","%2d:%2d - %s offset %d entry_size %d\n",(char *)0x0,
                         (ulong)(uint)i,(ulong)uaddr._4_4_,trie_objdef,ret,
                         *(undefined4 *)(name + 0x10));
            }
            uaddr._4_4_ = uaddr._4_4_ + 1;
          }
          _mpp_log_l(2,"kmpp_obj","init %d:%d obj trie failed\n","kmpp_objs_init",(ulong)(uint)i,
                     (ulong)uaddr._4_4_);
          objs = (KmppObjs *)root;
          return;
        }
        _mpp_log_l(2,"kmpp_obj","alloc objs failed\n","kmpp_objs_init");
      }
      else {
        _mpp_log_l(2,"kmpp_obj","init trie by root failed ret %d\n","kmpp_objs_init",
                   (ulong)(uint)local_38);
      }
    }
  }
  if (0 < count) {
    close(count);
    count = -1;
  }
  if (info != (MppTrieInfo *)0x0) {
    mpp_trie_deinit(info);
  }
  return;
}

Assistant:

__attribute__ ((constructor))
void kmpp_objs_init(void)
{
    static const char *dev = "/dev/kmpp_objs";
    KmppObjs *p = objs;
    void *root = NULL;
    MppTrie trie = NULL;
    MppTrieInfo *info;
    rk_s32 fd = -1;
    rk_s32 offset;
    rk_s32 count;
    rk_s32 ret;
    rk_s32 i;

    if (p) {
        obj_dbg_flow("objs already inited %p\n", p);
        kmpp_objs_deinit();
        p = NULL;
    }

    mpp_env_get_u32("kmpp_obj_debug", &kmpp_obj_debug, 0);

    fd = open(dev, O_RDWR);
    if (fd < 0) {
        obj_dbg_flow("%s open failed ret fd %d\n", dev, fd);
        goto __failed;
    }

    {
        rk_u64 uaddr = 0;

        ret = ioctl(fd, KMPP_SHM_IOC_QUERY_INFO, &uaddr);
        if (ret < 0) {
            mpp_loge_f("%s ioctl failed ret %d\n", dev, ret);
            goto __failed;
        }

        root = (void *)(intptr_t)uaddr;
        obj_dbg_share("query fd %d root %p from kernel\n", fd, root);
    }

    ret = mpp_trie_init_by_root(&trie, root);
    if (ret || !trie) {
        mpp_loge_f("init trie by root failed ret %d\n", ret);
        goto __failed;
    }

    if (kmpp_obj_debug & OBJ_DBG_SHARE)
        mpp_trie_dump_f(trie);

    info = mpp_trie_get_info(trie, "__count");
    count = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;

    p = mpp_calloc_size(KmppObjs, sizeof(KmppObjs) + sizeof(KmppObjDefImpl) * count);
    if (!p) {
        mpp_loge_f("alloc objs failed\n");
        goto __failed;
    }

    p->fd = fd;
    p->count = count;
    p->trie = trie;
    p->root = root;

    info = mpp_trie_get_info(trie, "__offset");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->entry_offset = offset;
    info = mpp_trie_get_info(trie, "__priv");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->priv_offset = offset;
    info = mpp_trie_get_info(trie, "__name_offset");
    offset = info ? *(rk_s32 *)mpp_trie_info_ctx(info) : 0;
    p->name_offset = offset;

    obj_dbg_share("count %d object offsets - priv %d name %d entry %d\n", count,
                  p->priv_offset, p->name_offset, p->entry_offset);

    info = mpp_trie_get_info_first(trie);

    for (i = 0; i < count && info; i++) {
        KmppObjDefImpl *impl = &p->defs[i];
        const char *name = mpp_trie_info_name(info);
        MppTrie trie_objdef = NULL;
        MppTrieInfo *info_objdef;

        offset = *(rk_s32 *)mpp_trie_info_ctx(info);
        ret = mpp_trie_init_by_root(&trie_objdef, root + offset);
        if (!trie_objdef) {
            mpp_loge_f("init %d:%d obj trie failed\n", count, i);
            break;
        }

        impl->trie = trie_objdef;

        info_objdef = mpp_trie_get_info(trie_objdef, "__index");
        impl->index = info_objdef ? *(rk_s32 *)mpp_trie_info_ctx(info_objdef) : -1;
        info_objdef = mpp_trie_get_info(trie_objdef, "__size");
        impl->entry_size = info_objdef ? *(rk_s32 *)mpp_trie_info_ctx(info_objdef) : 0;
        impl->name = name;

        info = mpp_trie_get_info_next(trie, info);
        obj_dbg_share("%2d:%2d - %s offset %d entry_size %d\n",
                      count, i, name, offset, impl->entry_size);
    }

    objs = p;

    return;

__failed:
    if (fd > 0) {
        close(fd);
        fd = -1;
    }
    if (trie) {
        mpp_trie_deinit(trie);
        trie = NULL;
    }
}